

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

char * replace_extension(char *filename,char *extension)

{
  size_t sVar1;
  size_t sVar2;
  char *__s;
  char *pcVar3;
  char *last_dot;
  char *result;
  size_t length;
  char *extension_local;
  char *filename_local;
  
  sVar1 = strlen(filename);
  sVar2 = strlen(extension);
  sVar1 = sVar1 + sVar2 + 1;
  __s = (char *)malloc(sVar1);
  pcVar3 = strrchr(filename,0x2e);
  if (pcVar3 == (char *)0x0) {
    snprintf(__s,sVar1,"%s%s",filename,extension);
  }
  else {
    snprintf(__s,sVar1,"%.*s%s",(ulong)(uint)((int)pcVar3 - (int)filename),filename,extension);
  }
  return __s;
}

Assistant:

const char* replace_extension(const char* filename, const char* extension) {
  size_t length = strlen(filename) + strlen(extension) + 1; /* +1 for \0. */
  char* result = xmalloc(length);
  char* last_dot = strrchr(filename, '.');
  if (last_dot == NULL) {
    snprintf(result, length, "%s%s", filename, extension);
  } else {
    snprintf(result, length, "%.*s%s", (int)(last_dot - filename), filename,
             extension);
  }
  return result;
}